

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_10a01::AsmWriteWLADX::writeInstruction
          (AsmWriteWLADX *this,Pointer pc,int numBits,int numBytesUsed,string *param,
          string *line_comment,CombinationBool accumulator_wide,CombinationBool index_wide,
          Combination8 data_bank,Combination16 direct_page,bool is_predicted)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  Options *pOVar9;
  byte bVar10;
  int k;
  ulong uVar11;
  FILE *pFVar12;
  char *pcVar13;
  ulong uVar14;
  
  prepareWrite(this,pc,true);
  pbVar8 = snestistics::RomAccessor::evalPtr(this->m_romData,pc);
  bVar10 = 1;
  if (this->m_options->asm_print_pc == false) {
    bVar10 = this->m_options->asm_print_bytes;
  }
  iVar2 = fprintf((FILE *)this->m_outFile,"    ");
  if ((bVar10 & 1) != 0) {
    uVar1 = 0x70;
    if (!is_predicted) {
      uVar1 = 0x20;
    }
    iVar3 = fprintf((FILE *)this->m_outFile,"/*%c",uVar1);
    iVar2 = iVar2 + iVar3;
  }
  pOVar9 = this->m_options;
  if (pOVar9->asm_print_register_sizes == true) {
    if (((uint3)accumulator_wide & 0x10000) == 0) {
      pFVar12 = (FILE *)this->m_outFile;
      iVar3 = 0x3f;
    }
    else if (((uint3)accumulator_wide & 0x100) == 0) {
      pFVar12 = (FILE *)this->m_outFile;
      iVar3 = 0x2a;
    }
    else {
      pFVar12 = (FILE *)this->m_outFile;
      if (((uint3)accumulator_wide & 1) == 0) {
        iVar3 = 0x6d;
      }
      else {
        iVar3 = 0x4d;
      }
    }
    fputc(iVar3,pFVar12);
    if (((uint3)index_wide & 0x10000) == 0) {
      pFVar12 = (FILE *)this->m_outFile;
      iVar3 = 0x3f;
    }
    else if (((uint3)index_wide & 0x100) == 0) {
      pFVar12 = (FILE *)this->m_outFile;
      iVar3 = 0x2a;
    }
    else {
      pFVar12 = (FILE *)this->m_outFile;
      if (((uint3)index_wide & 1) == 0) {
        iVar3 = 0x69;
      }
      else {
        iVar3 = 0x49;
      }
    }
    fputc(iVar3,pFVar12);
    fputc(0x20,(FILE *)this->m_outFile);
    iVar2 = iVar2 + 3;
    pOVar9 = this->m_options;
  }
  if (pOVar9->asm_print_db == true) {
    if (((uint3)data_bank & 0x10000) == 0) {
      __assert_fail("data_bank.has_value",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x179,
                    "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                   );
    }
    if (((uint3)data_bank & 0x100) == 0) {
      iVar3 = fprintf((FILE *)this->m_outFile,"   ");
    }
    else {
      iVar3 = fprintf((FILE *)this->m_outFile,"%02X ",(ulong)((uint3)data_bank & 0xff));
    }
    iVar2 = iVar2 + iVar3;
  }
  if (this->m_options->asm_print_dp == true) {
    if (((uint)direct_page >> 0x18 & 1) == 0) {
      __assert_fail("direct_page.has_value",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x182,
                    "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                   );
    }
    if (((uint)direct_page >> 0x10 & 1) == 0) {
      iVar3 = fprintf((FILE *)this->m_outFile,"     ");
    }
    else {
      iVar3 = fprintf((FILE *)this->m_outFile,"%04X ",(ulong)((uint)direct_page & 0xffff));
    }
    iVar2 = iVar2 + iVar3;
  }
  pOVar9 = this->m_options;
  if (pOVar9->asm_print_pc == true) {
    iVar3 = fprintf((FILE *)this->m_outFile,"%06X ",(ulong)pc);
    iVar2 = iVar2 + iVar3;
    pOVar9 = this->m_options;
  }
  if (pOVar9->asm_print_bytes == true) {
    uVar11 = 0;
    if (0 < numBytesUsed) {
      uVar11 = (ulong)(uint)numBytesUsed;
    }
    for (uVar14 = 0; iVar3 = numBytesUsed, uVar11 != uVar14; uVar14 = uVar14 + 1) {
      iVar3 = fprintf((FILE *)this->m_outFile,"%02X ",(ulong)pbVar8[uVar14]);
      iVar2 = iVar2 + iVar3;
    }
    for (; iVar3 < 4; iVar3 = iVar3 + 1) {
      iVar4 = fprintf((FILE *)this->m_outFile,"   ");
      iVar2 = iVar2 + iVar4;
    }
  }
  if ((~bVar10 & 1) == 0) {
    iVar3 = fprintf((FILE *)this->m_outFile,"*/ ");
    iVar2 = iVar2 + iVar3;
  }
  pcVar13 = *(char **)(snestistics::opCodeInfo + (ulong)*pbVar8 * 0x18 + 8);
  pFVar12 = (FILE *)this->m_outFile;
  if (this->m_options->asm_lower_case_op == true) {
    uVar5 = tolower((int)*pcVar13);
    uVar6 = tolower((int)pcVar13[1]);
    uVar7 = tolower((int)pcVar13[2]);
    iVar3 = fprintf(pFVar12,"%c%c%c",(ulong)uVar5,(ulong)uVar6,(ulong)uVar7);
  }
  else {
    iVar3 = fprintf(pFVar12,"%s",pcVar13);
  }
  iVar3 = iVar3 + iVar2;
  iVar2 = strcmp(*(char **)(snestistics::opCodeInfo + (ulong)*pbVar8 * 0x18 + 8),"BRL");
  if ((numBits != 0) && (iVar2 != 0)) {
    if (numBits == 8) {
      pcVar13 = ".b";
    }
    else if (numBits == 0x18) {
      pcVar13 = ".l";
    }
    else {
      if (numBits != 0x10) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                      ,0x1ab,
                      "void (anonymous namespace)::AsmWriteWLADX::writeInstruction(const Pointer, const int, const int, const std::string &, const std::string &, CombinationBool, CombinationBool, Combination8, Combination16, bool)"
                     );
      }
      pcVar13 = ".w";
    }
    iVar2 = fprintf((FILE *)this->m_outFile,pcVar13);
    iVar3 = iVar3 + iVar2;
  }
  if (param->_M_string_length != 0) {
    iVar2 = fprintf((FILE *)this->m_outFile," %s",(param->_M_dataplus)._M_p);
    iVar3 = iVar3 + iVar2;
  }
  iVar2 = 0x48;
  if (0x48 < iVar3) {
    iVar2 = iVar3;
  }
  writeCommentHelper(this,iVar3,(iVar2 - 0x45U & 0xfffffffc) + 0x48,line_comment);
  this->m_nextPC = numBytesUsed + pc;
  return;
}

Assistant:

void writeInstruction(const Pointer pc, const int numBits, const int numBytesUsed, const std::string &param, const std::string &line_comment, CombinationBool accumulator_wide, CombinationBool index_wide, Combination8 data_bank, Combination16 direct_page, bool is_predicted) {
		prepareWrite(pc);
		const uint8_t* data = m_romData.evalPtr(pc);

		bool overrideInstructionWithDB = false;

		if (numBytesUsed == 2 && data[0] == 0xF0 && data[1] == 0x80) {
			// WLA DX has a bug here, emit using .DB instad
			overrideInstructionWithDB = true;
		}

		// Keep track of bytes written so we can align comment column
		int nw = 0;

		const bool emitCommentPC = m_options.asm_print_pc || m_options.asm_print_bytes || overrideInstructionWithDB;

		nw += fprintf(m_outFile, "    ");
		if (emitCommentPC) {
			nw += fprintf(m_outFile, "/*%c", is_predicted ? 'p':' ');
		}

		if (m_options.asm_print_register_sizes) {
			if(!accumulator_wide.has_value) {
				fputc('?', m_outFile);
			} else if (accumulator_wide.single_value) {
				if (accumulator_wide.value) {
					fputc('M', m_outFile);
				} else {
					fputc('m', m_outFile);
				}
			} else {
				fputc('*', m_outFile);
			}
			if(!index_wide.has_value) {
				fputc('?', m_outFile);
			} else if (index_wide.single_value) {
				if (index_wide.value) {
					fputc('I', m_outFile);
				} else {
					fputc('i', m_outFile);
				}
			} else {
				fputc('*', m_outFile);
			}
			fputc(' ', m_outFile);
			nw += 3;
		}

		if (m_options.asm_print_db) {
			assert(data_bank.has_value);
			if (data_bank.single_value) {
				nw += fprintf(m_outFile, "%02X ", data_bank.value);
			} else {
				nw += fprintf(m_outFile, "   ");
			}
		}

		if (m_options.asm_print_dp) {
			assert(direct_page.has_value);
			if (direct_page.single_value) {
				nw += fprintf(m_outFile, "%04X ", direct_page.value);
			} else {
				nw += fprintf(m_outFile, "     ");
			}
		}

		if (m_options.asm_print_pc) {
			nw += fprintf(m_outFile, "%06X ", pc);
		}
		if (m_options.asm_print_bytes) {
			for (int k = 0; k < numBytesUsed; k++) {
				nw += fprintf(m_outFile, "%02X ", data[k]);
			}
			for (int k = numBytesUsed; k < 4; k++) {
				nw += fprintf(m_outFile, "   ");
			}
		}

		if (emitCommentPC && !overrideInstructionWithDB) {
			nw += fprintf(m_outFile, "*/ ");
		}

		const char * const op = opCodeInfo[data[0]].mnemonics;
		if (m_options.asm_lower_case_op) {
			nw += fprintf(m_outFile, "%c%c%c", tolower(op[0]), tolower(op[1]), tolower(op[2]));
		} else {
			nw += fprintf(m_outFile, "%s", op);
		}

		if (strcmp(opCodeInfo[data[0]].mnemonics, "BRL") == 0) {

		} else if (numBits == 0) {
		} else if (numBits == 8) {
			nw += fprintf(m_outFile, ".b");
		} else if (numBits == 16) {
			nw += fprintf(m_outFile, ".w");
		} else if (numBits == 24) {
			nw += fprintf(m_outFile, ".l");
		} else {
			assert(false);
		}

		if (!param.empty()) {
			nw += fprintf(m_outFile, " %s", param.c_str());
		}

		if (overrideInstructionWithDB) {
			nw += fprintf(m_outFile, "*/ ");
		}

		writeCommentHelper(nw, adjusted_column(nw), line_comment);

		if (overrideInstructionWithDB) {
			fprintf(m_outFile, ".DB ");
			for (int k = 0; k < numBytesUsed; k++) {
				fprintf(m_outFile, "$%02X%s", data[k], k != numBytesUsed-1 ? ", ":"");
			}
			fprintf(m_outFile, "\n");
		}

		m_nextPC = pc + numBytesUsed;
	}